

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O2

void __thiscall
FastPForLib::PFor::__encodeArray(PFor *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint32_t b;
  uint32_t uVar1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  DATATYPE *i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> exceptions;
  
  checkifdivisibleby(len,0x80);
  exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&exceptions,len);
  puVar3 = exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  i = exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start;
  b = determineBestBase(in,len);
  *out = (uint32_t)len;
  uVar5 = len >> 7;
  out[1] = b;
  lVar4 = 8;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    uVar1 = compressblockPFOR(this,in,(uint32_t *)((long)out + lVar4 + 4),b,&i);
    in = in + 0x80;
    *(uint *)((long)out + lVar4) =
         ((int)i - (int)exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0x7fffffcU) << 5 | uVar1 & 0x7f;
    lVar4 = lVar4 + ((ulong)((b & 0x1ffffff) << 4) | 4);
    puVar3 = i;
  }
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)((long)puVar3 -
              (long)exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    *(uint *)((long)out + lVar4) =
         exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar2];
    lVar4 = lVar4 + 4;
  }
  *nvalue = lVar4 >> 2;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&exceptions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t len, uint32_t *out,
                     size_t &nvalue) {
    checkifdivisibleby(len, BlockSize);
    const uint32_t *const initout(out);
    std::vector<DATATYPE> exceptions;
    exceptions.resize(len);
    DATATYPE *__restrict__ i = &exceptions[0];
    const uint32_t b = determineBestBase(in, len);
    *out++ = static_cast<uint32_t>(len);
    *out++ = b;
    for (size_t k = 0; k < len / BlockSize; ++k) {
      uint32_t *const headerout(out);
      ++out;
      uint32_t firstexcept = compressblockPFOR(in, out, b, i);
      out += (BlockSize * b) / 32;
      in += BlockSize;
      const uint32_t bitsforfirstexcept = blocksizeinbits;
      const uint32_t firstexceptmask = (1U << blocksizeinbits) - 1;
      const uint32_t exceptindex = static_cast<uint32_t>(i - &exceptions[0]);
      *headerout =
          (firstexcept & firstexceptmask) | (exceptindex << bitsforfirstexcept);
    }
    const size_t howmanyexcept = i - &exceptions[0];
    for (uint32_t t = 0; t < howmanyexcept; ++t)
      *out++ = exceptions[t];
    nvalue = out - initout;
  }